

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerReflection::emit_type
          (CompilerReflection *this,uint32_t type_id,bool *emitted_open_tag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Stream *pSVar3;
  ulong uVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  uint32_t v;
  SPIRType *type;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  uint uVar11;
  ulong uVar12;
  string __str;
  string name;
  string local_b0;
  string local_90;
  char *local_70;
  uint local_68;
  char local_60 [16];
  string local_50;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr + type_id);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_50,this,type,0);
  if (*emitted_open_tag == false) {
    pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"types","");
    simple_json::Stream::emit_json_key_object(pSVar3,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    *emitted_open_tag = true;
  }
  cVar6 = '\x01';
  if (9 < type_id) {
    uVar2 = type_id;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar2 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001e0485;
      }
      if (uVar2 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001e0485;
      }
      if (uVar2 < 10000) goto LAB_001e0485;
      bVar7 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar7);
    cVar6 = cVar6 + '\x01';
  }
LAB_001e0485:
  pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_90,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,type_id);
  plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x2beef5);
  paVar1 = &local_b0.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_b0.field_2._M_allocated_capacity = *psVar10;
    local_b0.field_2._8_8_ = plVar8[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar10;
    local_b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  simple_json::Stream::emit_json_key_object(pSVar3,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
  simple_json::Stream::emit_json_key_value(pSVar3,&local_b0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar7 = Compiler::is_physical_pointer((Compiler *)this,type);
  if (bVar7) {
    pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
    uVar2 = (type->parent_type).id;
    cVar6 = '\x01';
    if (9 < uVar2) {
      uVar11 = uVar2;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar11 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001e0736;
        }
        if (uVar11 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001e0736;
        }
        if (uVar11 < 10000) goto LAB_001e0736;
        bVar7 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar7);
      cVar6 = cVar6 + '\x01';
    }
LAB_001e0736:
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar6);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,uVar2);
    plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2beef5);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90.field_2._8_8_ = plVar8[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_90._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    simple_json::Stream::emit_json_key_value(pSVar3,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"physical_pointer","");
    simple_json::Stream::emit_json_key(pSVar3,&local_b0);
    StringStream<4096UL,_4096UL>::append(&pSVar3->buffer,"true",4);
  }
  else {
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pSVar3 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"members","");
      simple_json::Stream::emit_json_key_array(pSVar3,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      uVar4 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (uVar4 != 0) {
        uVar12 = 0;
        do {
          emit_type_member(this,type,(uint32_t)uVar12);
          uVar12 = (ulong)((uint32_t)uVar12 + 1);
        } while (uVar12 < uVar4);
      }
      simple_json::Stream::end_json_array
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      goto LAB_001e097f;
    }
    emit_type_array(this,type);
    pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"type","");
    uVar2 = (type->parent_type).id;
    cVar6 = '\x01';
    if (9 < uVar2) {
      uVar11 = uVar2;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar11 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001e0852;
        }
        if (uVar11 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001e0852;
        }
        if (uVar11 < 10000) goto LAB_001e0852;
        bVar7 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar7);
      cVar6 = cVar6 + '\x01';
    }
LAB_001e0852:
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar6);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,uVar2);
    puVar9 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2beef5);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90.field_2._8_8_ = puVar9[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_90._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    simple_json::Stream::emit_json_key_value(pSVar3,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pSVar3 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"array_stride","");
    v = Compiler::get_decoration((Compiler *)this,(ID)type_id,DecorationArrayStride);
    simple_json::Stream::emit_json_key(pSVar3,&local_b0);
    StringStream<4096UL,_4096UL>::operator<<(&pSVar3->buffer,v);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
LAB_001e097f:
  simple_json::Stream::end_json_object
            ((this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerReflection::emit_type(uint32_t type_id, bool &emitted_open_tag)
{
	auto &type = get<SPIRType>(type_id);
	auto name = type_to_glsl(type);

	if (!emitted_open_tag)
	{
		json_stream->emit_json_key_object("types");
		emitted_open_tag = true;
	}
	json_stream->emit_json_key_object("_" + std::to_string(type_id));
	json_stream->emit_json_key_value("name", name);

	if (is_physical_pointer(type))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("physical_pointer", true);
	}
	else if (!type.array.empty())
	{
		emit_type_array(type);
		json_stream->emit_json_key_value("type", "_" + std::to_string(type.parent_type));
		json_stream->emit_json_key_value("array_stride", get_decoration(type_id, DecorationArrayStride));
	}
	else
	{
		json_stream->emit_json_key_array("members");
		// FIXME ideally we'd like to emit the size of a structure as a
		// convenience to people parsing the reflected JSON.  The problem
		// is that there's no implicit size for a type.  It's final size
		// will be determined by the top level declaration in which it's
		// included.  So there might be one size for the struct if it's
		// included in a std140 uniform block and another if it's included
		// in a std430 uniform block.
		// The solution is to include *all* potential sizes as a map of
		// layout type name to integer, but that will probably require
		// some additional logic being written in this class, or in the
		// parent CompilerGLSL class.
		auto size = type.member_types.size();
		for (uint32_t i = 0; i < size; ++i)
		{
			emit_type_member(type, i);
		}
		json_stream->end_json_array();
	}

	json_stream->end_json_object();
}